

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

N_Vector N_VNew_Serial(sunindextype length,SUNContext_conflict sunctx)

{
  void *pvVar1;
  N_Vector p_Var2;
  void *pvVar3;
  
  p_Var2 = N_VNewEmpty_Serial(length,sunctx);
  if (length < 1) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = malloc(length << 3);
  }
  pvVar1 = p_Var2->content;
  *(undefined4 *)((long)pvVar1 + 8) = 1;
  *(void **)((long)pvVar1 + 0x10) = pvVar3;
  return p_Var2;
}

Assistant:

N_Vector N_VNew_Serial(sunindextype length, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  N_Vector v;
  sunrealtype* data;

  SUNAssertNull(length >= 0, SUN_ERR_ARG_OUTOFRANGE);

  v = NULL;
  v = N_VNewEmpty_Serial(length, sunctx);
  SUNCheckLastErrNull();

  /* Create data */
  data = NULL;
  if (length > 0)
  {
    data = (sunrealtype*)malloc(length * sizeof(sunrealtype));
    SUNAssertNull(data, SUN_ERR_MALLOC_FAIL);
  }

  /* Attach data */
  NV_OWN_DATA_S(v) = SUNTRUE;
  NV_DATA_S(v)     = data;

  return (v);
}